

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder_pkits_unittest.cc
# Opt level: O2

void bssl::anon_unknown_17::PathBuilderPkitsTestDelegate::RunTest
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *cert_ders,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *crl_ders,PkitsTestInfo *orig_info)

{
  size_t *this;
  pointer pbVar1;
  bool bVar2;
  size_t sVar3;
  CertPathBuilderResultPath *pCVar4;
  pointer *__ptr;
  long lVar5;
  char *pcVar6;
  char *in_R9;
  ulong uVar7;
  pointer pbVar8;
  bool bVar9;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  basic_string_view<char,_std::char_traits<char>_> __x_11;
  basic_string_view<char,_std::char_traits<char>_> __x_12;
  basic_string_view<char,_std::char_traits<char>_> __x_13;
  basic_string_view<char,_std::char_traits<char>_> __x_14;
  basic_string_view<char,_std::char_traits<char>_> __x_15;
  basic_string_view<char,_std::char_traits<char>_> __x_16;
  basic_string_view<char,_std::char_traits<char>_> __x_17;
  basic_string_view<char,_std::char_traits<char>_> __x_18;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_11;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_12;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_13;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_14;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_15;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_16;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_17;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_18;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_328;
  AssertHelper local_320;
  AssertionResult gtest_ar;
  AssertHelper local_2f8;
  Result result;
  __uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> local_2c0;
  CrlCheckingPathBuilderDelegate path_builder_delegate;
  shared_ptr<const_bssl::ParsedCertificate> target_cert;
  ParsedCertificateList certs;
  int64_t verify_time;
  CertIssuerSourceStatic cert_issuer_source;
  __shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> local_1f8;
  shared_ptr<const_bssl::ParsedCertificate> local_1e8;
  __shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> local_1d0;
  CertPathBuilder path_builder;
  TrustStoreInMemory trust_store;
  PkitsTestInfo info;
  
  PkitsTestInfo::PkitsTestInfo(&info,orig_info);
  trust_store.entries_._M_h._M_buckets = (__buckets_ptr)0x0;
  bVar9 = (cert_ders->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start ==
          (cert_ders->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish;
  trust_store.super_TrustStore.super_CertIssuerSource._vptr_CertIssuerSource._0_1_ = !bVar9;
  if (bVar9) {
    testing::Message::Message((Message *)&cert_issuer_source);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&path_builder,(internal *)&trust_store,
               (AssertionResult *)"cert_ders.empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&path_builder_delegate,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_pkits_unittest.cc"
               ,0x95,(char *)CONCAT71(path_builder.out_result_.paths.
                                      super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                      path_builder.out_result_.paths.
                                      super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_1_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&path_builder_delegate,(Message *)&cert_issuer_source);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&path_builder_delegate);
    ::std::__cxx11::string::~string((string *)&path_builder);
    if (cert_issuer_source.super_CertIssuerSource._vptr_CertIssuerSource != (_func_int **)0x0) {
      (**(code **)(*cert_issuer_source.super_CertIssuerSource._vptr_CertIssuerSource + 8))();
    }
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&trust_store.entries_);
    goto LAB_00260705;
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&trust_store.entries_);
  certs.
  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  certs.
  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  certs.
  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar1 = (cert_ders->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar8 = (cert_ders->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar1; pbVar8 = pbVar8 + 1) {
    CertErrors::CertErrors((CertErrors *)&cert_issuer_source);
    local_2c0._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
         (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
         CRYPTO_BUFFER_new((uint8_t *)(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length,
                           (CRYPTO_BUFFER_POOL *)0x0);
    path_builder.out_result_.paths.
    super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
    bVar9 = ParsedCertificate::CreateAndAddToVector
                      ((UniquePtr<CRYPTO_BUFFER> *)&local_2c0,
                       (ParseCertificateOptions *)&path_builder,&certs,
                       (CertErrors *)&cert_issuer_source);
    path_builder_delegate.super_SimplePathBuilderDelegate.super_CertPathBuilderDelegate.
    super_VerifyCertificateChainDelegate._vptr_VerifyCertificateChainDelegate._0_1_ = bVar9;
    path_builder_delegate.super_SimplePathBuilderDelegate.min_rsa_modulus_length_bits_ = 0;
    ::std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_2c0);
    if ((char)path_builder_delegate.super_SimplePathBuilderDelegate.super_CertPathBuilderDelegate.
              super_VerifyCertificateChainDelegate._vptr_VerifyCertificateChainDelegate == '\0') {
      testing::Message::Message((Message *)&result);
      CertErrors::ToDebugString_abi_cxx11_
                ((string *)&path_builder,(CertErrors *)&cert_issuer_source);
      ::std::operator<<((ostream *)
                        (result.paths.
                         super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 2),(string *)&path_builder);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&trust_store,(internal *)&path_builder_delegate,
                 (AssertionResult *)
                 "ParsedCertificate::CreateAndAddToVector( bssl::UniquePtr<CRYPTO_BUFFER>( CRYPTO_BUFFER_new(reinterpret_cast<const uint8_t *>(der.data()), der.size(), nullptr)), {}, &certs, &errors)"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_pkits_unittest.cc"
                 ,0x9d,(char *)CONCAT71(trust_store.super_TrustStore.super_CertIssuerSource.
                                        _vptr_CertIssuerSource._1_7_,
                                        trust_store.super_TrustStore.super_CertIssuerSource.
                                        _vptr_CertIssuerSource._0_1_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
      ::std::__cxx11::string::~string((string *)&trust_store);
      ::std::__cxx11::string::~string((string *)&path_builder);
      if (result.paths.
          super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (*(code *)*(pointer *)
                   ((long)&((((result.paths.
                               super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                             super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                             .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>.
                            _M_head_impl)->certs).
                           super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                   + 8))();
      }
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&path_builder_delegate.super_SimplePathBuilderDelegate.
                        min_rsa_modulus_length_bits_);
      CertErrors::~CertErrors((CertErrors *)&cert_issuer_source);
      goto LAB_002606f8;
    }
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&path_builder_delegate.super_SimplePathBuilderDelegate.
                      min_rsa_modulus_length_bits_);
    CertErrors::~CertErrors((CertErrors *)&cert_issuer_source);
  }
  TrustStoreInMemory::TrustStoreInMemory(&trust_store);
  ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1f8,
             &(certs.
               super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>);
  TrustStoreInMemory::AddTrustAnchor
            (&trust_store,(shared_ptr<const_bssl::ParsedCertificate> *)&local_1f8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f8._M_refcount);
  CertIssuerSourceStatic::CertIssuerSourceStatic(&cert_issuer_source);
  lVar5 = 0x10;
  for (uVar7 = 1;
      uVar7 < ((long)(cert_ders->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(cert_ders->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U; uVar7 = uVar7 + 1) {
    ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1d0,
               (__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&((certs.
                         super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr + lVar5));
    CertIssuerSourceStatic::AddCert
              (&cert_issuer_source,(shared_ptr<const_bssl::ParsedCertificate> *)&local_1d0);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d0._M_refcount);
    lVar5 = lVar5 + 0x10;
  }
  ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&target_cert.
              super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>,
             &certs.
              super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].
              super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>);
  bVar9 = bssl::der::GeneralizedTimeToPosixTime(&info.time,&verify_time);
  this = &path_builder_delegate.super_SimplePathBuilderDelegate.min_rsa_modulus_length_bits_;
  path_builder_delegate.super_SimplePathBuilderDelegate.super_CertPathBuilderDelegate.
  super_VerifyCertificateChainDelegate._vptr_VerifyCertificateChainDelegate._0_1_ = bVar9;
  path_builder_delegate.super_SimplePathBuilderDelegate.min_rsa_modulus_length_bits_ = 0;
  if (bVar9) {
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this);
    SimplePathBuilderDelegate::SimplePathBuilderDelegate
              (&path_builder_delegate.super_SimplePathBuilderDelegate,0x400,kMaxValue);
    path_builder_delegate.super_SimplePathBuilderDelegate.super_CertPathBuilderDelegate.
    super_VerifyCertificateChainDelegate._vptr_VerifyCertificateChainDelegate =
         (VerifyCertificateChainDelegate)&PTR_IsSignatureAlgorithmAcceptable_0059ede8;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&path_builder_delegate.der_crls_,crl_ders);
    path_builder_delegate.verify_time_ = verify_time;
    path_builder_delegate.max_age_ = 0x3c26700;
    sVar3 = strlen(info.test_number);
    __x._M_str = info.test_number;
    __x._M_len = sVar3;
    __y._M_str = "4.4.19";
    __y._M_len = 6;
    bVar9 = ::std::operator==(__x,__y);
    if (((((((bVar9) ||
            (__x_00._M_str = info.test_number, __x_00._M_len = sVar3, __y_00._M_str = "4.5.3",
            __y_00._M_len = 5, bVar9 = ::std::operator==(__x_00,__y_00), bVar9)) ||
           (__x_01._M_str = info.test_number, __x_01._M_len = sVar3, __y_01._M_str = "4.5.4",
           __y_01._M_len = 5, bVar9 = ::std::operator==(__x_01,__y_01), bVar9)) ||
          ((__x_02._M_str = info.test_number, __x_02._M_len = sVar3, __y_02._M_str = "4.5.6",
           __y_02._M_len = 5, bVar9 = ::std::operator==(__x_02,__y_02), bVar9 ||
           (__x_03._M_str = info.test_number, __x_03._M_len = sVar3, __y_03._M_str = "4.14.1",
           __y_03._M_len = 6, bVar9 = ::std::operator==(__x_03,__y_03), bVar9)))) ||
         ((__x_04._M_str = info.test_number, __x_04._M_len = sVar3, __y_04._M_str = "4.14.4",
          __y_04._M_len = 6, bVar9 = ::std::operator==(__x_04,__y_04), bVar9 ||
          ((__x_05._M_str = info.test_number, __x_05._M_len = sVar3, __y_05._M_str = "4.14.5",
           __y_05._M_len = 6, bVar9 = ::std::operator==(__x_05,__y_05), bVar9 ||
           (__x_06._M_str = info.test_number, __x_06._M_len = sVar3, __y_06._M_str = "4.14.7",
           __y_06._M_len = 6, bVar9 = ::std::operator==(__x_06,__y_06), bVar9)))))) ||
        (__x_07._M_str = info.test_number, __x_07._M_len = sVar3, __y_07._M_str = "4.14.18",
        __y_07._M_len = 7, bVar9 = ::std::operator==(__x_07,__y_07), bVar9)) ||
       (((((__x_08._M_str = info.test_number, __x_08._M_len = sVar3, __y_08._M_str = "4.14.19",
           __y_08._M_len = 7, bVar9 = ::std::operator==(__x_08,__y_08), bVar9 ||
           (__x_09._M_str = info.test_number, __x_09._M_len = sVar3, __y_09._M_str = "4.14.22",
           __y_09._M_len = 7, bVar9 = ::std::operator==(__x_09,__y_09), bVar9)) ||
          (__x_10._M_str = info.test_number, __x_10._M_len = sVar3, __y_10._M_str = "4.14.24",
          __y_10._M_len = 7, bVar9 = ::std::operator==(__x_10,__y_10), bVar9)) ||
         (((__x_11._M_str = info.test_number, __x_11._M_len = sVar3, __y_11._M_str = "4.14.25",
           __y_11._M_len = 7, bVar9 = ::std::operator==(__x_11,__y_11), bVar9 ||
           (__x_12._M_str = info.test_number, __x_12._M_len = sVar3, __y_12._M_str = "4.14.28",
           __y_12._M_len = 7, bVar9 = ::std::operator==(__x_12,__y_12), bVar9)) ||
          ((__x_13._M_str = info.test_number, __x_13._M_len = sVar3, __y_13._M_str = "4.14.29",
           __y_13._M_len = 7, bVar9 = ::std::operator==(__x_13,__y_13), bVar9 ||
           ((__x_14._M_str = info.test_number, __x_14._M_len = sVar3, __y_14._M_str = "4.14.30",
            __y_14._M_len = 7, bVar9 = ::std::operator==(__x_14,__y_14), bVar9 ||
            (__x_15._M_str = info.test_number, __x_15._M_len = sVar3, __y_15._M_str = "4.14.33",
            __y_15._M_len = 7, bVar9 = ::std::operator==(__x_15,__y_15), bVar9)))))))) ||
        ((__x_16._M_str = info.test_number, __x_16._M_len = sVar3, __y_16._M_str = "4.15.1",
         __y_16._M_len = 6, bVar9 = ::std::operator==(__x_16,__y_16), bVar9 ||
         (__x_17._M_str = info.test_number, __x_17._M_len = sVar3, __y_17._M_str = "4.15.5",
         __y_17._M_len = 6, bVar9 = ::std::operator==(__x_17,__y_17), bVar9)))))) {
      bVar9 = false;
LAB_00260234:
      info.should_validate = bVar9;
    }
    else {
      __x_18._M_str = info.test_number;
      __x_18._M_len = sVar3;
      __y_18._M_str = "4.15.4";
      __y_18._M_len = 6;
      bVar2 = ::std::operator==(__x_18,__y_18);
      bVar9 = true;
      if (bVar2) goto LAB_00260234;
    }
    local_1e8.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         target_cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_1e8.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         target_cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    target_cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    target_cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    CertPathBuilder::CertPathBuilder
              (&path_builder,&local_1e8,&trust_store.super_TrustStore,
               (CertPathBuilderDelegate *)&path_builder_delegate,&info.time,ANY_EKU,
               info.initial_explicit_policy,&info.initial_policy_set,
               info.initial_policy_mapping_inhibit,info.initial_inhibit_any_policy);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1e8.
                super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    CertPathBuilder::AddCertIssuerSource(&path_builder,&cert_issuer_source.super_CertIssuerSource);
    CertPathBuilder::Run(&result,&path_builder);
    bVar9 = info.should_validate;
    bVar2 = CertPathBuilder::Result::HasValidPath(&result);
    if (bVar9 == bVar2) {
LAB_00260563:
      bVar9 = CertPathBuilder::Result::HasValidPath(&result);
      if (bVar9) {
        pCVar4 = CertPathBuilder::Result::GetBestValidPath(&result);
        testing::internal::
        CmpHelperEQ<std::set<bssl::der::Input,std::less<bssl::der::Input>,std::allocator<bssl::der::Input>>,std::set<bssl::der::Input,std::less<bssl::der::Input>,std::allocator<bssl::der::Input>>>
                  ((internal *)&gtest_ar,"info.user_constrained_policy_set",
                   "result.GetBestValidPath()->user_constrained_policy_set",
                   &info.user_constrained_policy_set,&pCVar4->user_constrained_policy_set);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_328);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_320,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_pkits_unittest.cc"
                     ,0x102,pcVar6);
          testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_328);
          testing::internal::AssertHelper::~AssertHelper(&local_320);
          if (local_328._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_328._M_head_impl + 8))();
          }
        }
        ::std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
      }
    }
    else {
      testing::Message::Message((Message *)&local_328);
      for (uVar7 = 0;
          uVar7 < (ulong)((long)result.paths.
                                super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)result.paths.
                                super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1)
      {
        pCVar4 = result.paths.
                 super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_t.
                 super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                 .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl;
        ::std::operator<<((ostream *)(local_328._M_head_impl + 0x10),"path ");
        ::std::ostream::_M_insert<unsigned_long>((ulong)(local_328._M_head_impl + 0x10));
        ::std::operator<<((ostream *)(local_328._M_head_impl + 0x10)," errors:\n");
        CertPathErrors::ToDebugString_abi_cxx11_((string *)&gtest_ar,&pCVar4->errors,&pCVar4->certs)
        ;
        ::std::operator<<((ostream *)(local_328._M_head_impl + 0x10),(string *)&gtest_ar);
        ::std::operator<<((ostream *)(local_328._M_head_impl + 0x10),"\n");
        ::std::__cxx11::string::~string((string *)&gtest_ar);
      }
      local_320.data_._0_1_ = CertPathBuilder::Result::HasValidPath(&result);
      testing::internal::CmpHelperEQ<bool,bool>
                ((internal *)&gtest_ar,"info.should_validate","result.HasValidPath()",
                 &info.should_validate,(bool *)&local_320);
      if (gtest_ar.success_ != false) {
        ::std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        if (local_328._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_328._M_head_impl + 8))();
        }
        goto LAB_00260563;
      }
      testing::Message::Message((Message *)&local_320);
      testing::operator<<((ostream *)(CONCAT71(local_320.data_._1_7_,local_320.data_._0_1_) + 0x10),
                          (Message *)&local_328);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_2f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_pkits_unittest.cc"
                 ,0xfd,pcVar6);
      testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_320);
      testing::internal::AssertHelper::~AssertHelper(&local_2f8);
      if ((long *)CONCAT71(local_320.data_._1_7_,local_320.data_._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_320.data_._1_7_,local_320.data_._0_1_) + 8))();
      }
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      if (local_328._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_328._M_head_impl + 8))();
      }
    }
    CertPathBuilder::Result::~Result(&result);
    CertPathBuilder::~CertPathBuilder(&path_builder);
    CrlCheckingPathBuilderDelegate::~CrlCheckingPathBuilderDelegate(&path_builder_delegate);
  }
  else {
    testing::Message::Message((Message *)&result);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&path_builder,(internal *)&path_builder_delegate,
               (AssertionResult *)"der::GeneralizedTimeToPosixTime(info.time, &verify_time)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_pkits_unittest.cc"
               ,0xaf,(char *)CONCAT71(path_builder.out_result_.paths.
                                      super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                      path_builder.out_result_.paths.
                                      super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_1_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    ::std::__cxx11::string::~string((string *)&path_builder);
    if (result.paths.
        super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)*(pointer *)
                 ((long)&((((result.paths.
                             super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                           super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                           .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>.
                          _M_head_impl)->certs).
                         super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                 + 8))();
    }
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&target_cert.
              super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CertIssuerSourceStatic::~CertIssuerSourceStatic(&cert_issuer_source);
  TrustStoreInMemory::~TrustStoreInMemory(&trust_store);
LAB_002606f8:
  ::std::
  vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ::~vector(&certs);
LAB_00260705:
  PkitsTestInfo::~PkitsTestInfo(&info);
  return;
}

Assistant:

static void RunTest(std::vector<std::string> cert_ders,
                      std::vector<std::string> crl_ders,
                      const PkitsTestInfo &orig_info) {
    PkitsTestInfo info = orig_info;

    ASSERT_FALSE(cert_ders.empty());
    ParsedCertificateList certs;
    for (const std::string &der : cert_ders) {
      CertErrors errors;
      ASSERT_TRUE(ParsedCertificate::CreateAndAddToVector(
          bssl::UniquePtr<CRYPTO_BUFFER>(
              CRYPTO_BUFFER_new(reinterpret_cast<const uint8_t *>(der.data()),
                                der.size(), nullptr)),
          {}, &certs, &errors))
          << errors.ToDebugString();
    }
    // First entry in the PKITS chain is the trust anchor.
    // TODO(mattm): test with all possible trust anchors in the trust store?
    TrustStoreInMemory trust_store;

    trust_store.AddTrustAnchor(certs[0]);

    // TODO(mattm): test with other irrelevant certs in cert_issuer_sources?
    CertIssuerSourceStatic cert_issuer_source;
    for (size_t i = 1; i < cert_ders.size() - 1; ++i) {
      cert_issuer_source.AddCert(certs[i]);
    }

    std::shared_ptr<const ParsedCertificate> target_cert(certs.back());

    int64_t verify_time;
    ASSERT_TRUE(der::GeneralizedTimeToPosixTime(info.time, &verify_time));
    CrlCheckingPathBuilderDelegate path_builder_delegate(
        crl_ders, verify_time, /*max_age=*/kOneYear * 2, 1024,
        SimplePathBuilderDelegate::DigestPolicy::kWeakAllowSha1);

    std::string_view test_number = info.test_number;
    if (test_number == "4.4.19" || test_number == "4.5.3" ||
        test_number == "4.5.4" || test_number == "4.5.6") {
      // 4.4.19 - fails since CRL is signed by a certificate that is not part
      //          of the verified chain, which is not supported.
      // 4.5.3 - fails since non-URI distribution point names are not supported
      // 4.5.4, 4.5.6 - fails since CRL is signed by a certificate that is not
      //                part of verified chain, and also non-URI distribution
      //                point names not supported
      info.should_validate = false;
    } else if (test_number == "4.14.1" || test_number == "4.14.4" ||
               test_number == "4.14.5" || test_number == "4.14.7" ||
               test_number == "4.14.18" || test_number == "4.14.19" ||
               test_number == "4.14.22" || test_number == "4.14.24" ||
               test_number == "4.14.25" || test_number == "4.14.28" ||
               test_number == "4.14.29" || test_number == "4.14.30" ||
               test_number == "4.14.33") {
      // 4.14 tests:
      // .1 - fails since non-URI distribution point names not supported
      // .2, .3 - fails since non-URI distribution point names not supported
      //          (but test is expected to fail for other reason)
      // .4, .5 - fails since non-URI distribution point names not supported,
      //          also uses nameRelativeToCRLIssuer which is not supported
      // .6 - fails since non-URI distribution point names not supported, also
      //      uses nameRelativeToCRLIssuer which is not supported (but test is
      //      expected to fail for other reason)
      // .7 - fails since relative distributionPointName not supported
      // .8, .9 - fails since relative distributionPointName not supported (but
      //          test is expected to fail for other reason)
      // .10, .11, .12, .13, .14, .27, .35 - PASS
      // .15, .16, .17, .20, .21 - fails since onlySomeReasons is not supported
      //                           (but test is expected to fail for other
      //                           reason)
      // .18, .19 - fails since onlySomeReasons is not supported
      // .22, .24, .25, .28, .29, .30, .33 - fails since indirect CRLs are not
      //                                     supported
      // .23, .26, .31, .32, .34 - fails since indirect CRLs are not supported
      //                           (but test is expected to fail for other
      //                           reason)
      info.should_validate = false;
    } else if (test_number == "4.15.1" || test_number == "4.15.5") {
      // 4.15 tests:
      // .1 - fails due to unhandled critical deltaCRLIndicator extension
      // .2, .3, .6, .7, .8, .9, .10 - PASS since expected cert status is
      //                               reflected in base CRL and delta CRL is
      //                               ignored
      // .5 - fails, cert status is "on hold" in base CRL but the delta CRL
      //      which removes the cert from CRL is ignored
      info.should_validate = false;
    } else if (test_number == "4.15.4") {
      // 4.15.4 - Invalid delta-CRL Test4 has the target cert marked revoked in
      // a delta-CRL. Since delta-CRLs are not supported, the chain validates
      // successfully.
      info.should_validate = true;
    }

    CertPathBuilder path_builder(
        std::move(target_cert), &trust_store, &path_builder_delegate, info.time,
        KeyPurpose::ANY_EKU, info.initial_explicit_policy,
        info.initial_policy_set, info.initial_policy_mapping_inhibit,
        info.initial_inhibit_any_policy);
    path_builder.AddCertIssuerSource(&cert_issuer_source);

    CertPathBuilder::Result result = path_builder.Run();

    if (info.should_validate != result.HasValidPath()) {
      testing::Message msg;
      for (size_t i = 0; i < result.paths.size(); ++i) {
        const bssl::CertPathBuilderResultPath *result_path =
            result.paths[i].get();
        msg << "path " << i << " errors:\n"
            << result_path->errors.ToDebugString(result_path->certs) << "\n";
      }
      ASSERT_EQ(info.should_validate, result.HasValidPath()) << msg;
    }

    if (result.HasValidPath()) {
      EXPECT_EQ(info.user_constrained_policy_set,
                result.GetBestValidPath()->user_constrained_policy_set);
    }
  }